

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O2

value * __thiscall
mjs::value_representation::get_value
          (value *__return_storage_ptr__,value_representation *this,gc_heap *heap)

{
  ulong uVar1;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  uint uVar4;
  undefined1 *rhs;
  gc_heap_ptr_untyped *this_00;
  char *__assertion;
  value_type t;
  undefined1 local_1c0 [40];
  gc_heap *local_198;
  wostringstream woss;
  
  uVar1 = this->repr_;
  if ((~uVar1 & 0x7ff0000000000000) != 0 || (uVar1 & 0xf000000000000) == 0) {
    __return_storage_ptr__->type_ = number;
    *(ulong *)&__return_storage_ptr__->field_1 = uVar1;
    return __return_storage_ptr__;
  }
  t = ((ushort)(uVar1 >> 0x30) & 0xf) - null;
  uVar4 = (uint)uVar1;
  switch(t) {
  case undefined:
    if (uVar4 == 0) {
      rhs = (undefined1 *)&value::undefined;
LAB_00156682:
      value::value(__return_storage_ptr__,(value *)rhs);
      return __return_storage_ptr__;
    }
    __assertion = "!payload";
    uVar4 = 0x45;
    break;
  case null:
    if (uVar4 == 0) {
      rhs = value::null;
      goto LAB_00156682;
    }
    __assertion = "!payload";
    uVar4 = 0x46;
    break;
  case boolean:
    if (uVar4 < 2) {
      __return_storage_ptr__->type_ = boolean;
      (__return_storage_ptr__->field_1).b_ = SUB81(uVar1,0);
      return __return_storage_ptr__;
    }
    __assertion = "payload == 0 || payload == 1";
    uVar4 = 0x47;
    break;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
    pwVar2 = std::operator<<((wostream *)&woss,"Not handled: ");
    pbVar3 = mjs::operator<<(pwVar2,t);
    pwVar2 = std::operator<<(pbVar3," ");
    std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
    std::__cxx11::wstringbuf::str();
    local_1c0._32_8_ = local_1c0._8_8_;
    local_198 = (gc_heap *)local_1c0._0_8_;
    throw_runtime_error((wstring_view *)(local_1c0 + 0x20),
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                        ,0x4f);
  case string:
    gc_heap::unsafe_create_from_position<mjs::gc_string>((gc_heap *)local_1c0,(uint32_t)heap);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&woss,(gc_heap_ptr_untyped *)local_1c0);
    value::value(__return_storage_ptr__,(string *)&woss);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
    this_00 = (gc_heap_ptr_untyped *)local_1c0;
    goto LAB_00156670;
  case object:
    gc_heap::unsafe_create_from_position<mjs::object>((gc_heap *)&woss,(uint32_t)heap);
    value::value(__return_storage_ptr__,(object_ptr *)&woss);
    this_00 = (gc_heap_ptr_untyped *)&woss;
LAB_00156670:
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(this_00);
    return __return_storage_ptr__;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                ,uVar4,"value mjs::value_representation::get_value(gc_heap &) const");
}

Assistant:

value value_representation::get_value(gc_heap& heap) const {
    if (!is_special(repr_)) {
        double d;
        static_assert(sizeof(d) == sizeof(repr_));
        std::memcpy(&d, &repr_, sizeof(d));
        return value{d};
    }
    const auto type    = type_from_repr(repr_);
    const auto payload = static_cast<uint32_t>(repr_);
    switch (type) {
    case value_type::undefined: assert(!payload); return value::undefined;
    case value_type::null:      assert(!payload); return value::null;
    case value_type::boolean:   assert(payload == 0 || payload == 1); return value{!!payload};
    case value_type::number:    /*should be handled above*/ break;
    case value_type::string:    return value{string{heap.unsafe_create_from_position<gc_string>(payload)}};
    case value_type::object:    return value{heap.unsafe_create_from_position<object>(payload)};
    default:                    break;
    }
    std::wostringstream woss;
    woss << "Not handled: " << type << " " << repr_;
    THROW_RUNTIME_ERROR(woss.str());
}